

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
hexdump_reader::perform(hexdump_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  undefined8 *puVar1;
  ReadWriter_ptr rd;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (1 < g_verbose) {
    printf("dohexdump(%s, %08llx, %08zx, %08zx, %s)\n",(this->_readername)._M_dataplus._M_p,
           this->_ofs,this->_storedsize,this->_fullsize,(this->_comptype)._M_dataplus._M_p);
  }
  readercollection::getbyname((readercollection *)&rd,(string *)rdlist);
  if (rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    (*(rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ReadWriter[4])
              (rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->_ofs);
    if ((this->_comptype)._M_string_length == 0) {
      std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_28,&rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
      dorawhexdump(this,(ReadWriter_ptr *)&local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "hexdump: invalid rdname";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dohexdump(%s, %08llx, %08zx, %08zx, %s)\n", _readername.c_str(), _ofs, _storedsize, _fullsize, _comptype.c_str());

        ReadWriter_ptr rd= rdlist.getbyname(_readername);
        if (!rd) throw "hexdump: invalid rdname";

        rd->setpos(_ofs);

        if (_comptype.empty())
            dorawhexdump(rd);
#ifndef _NO_COMPRESS
        else
            docomphexdump(rd);
#endif
    }